

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
::InnerMap::erase(InnerMap *this,iterator it)

{
  void **ppvVar1;
  void *pvVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *this_00;
  Node *item;
  bool bVar3;
  LogMessage *pLVar4;
  Node *pNVar5;
  size_type sVar6;
  size_type sVar7;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  pVar8;
  LogFinisher local_a9;
  TreeIterator local_a8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (it.m_ != this) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x248);
    pLVar4 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (it.m_) == (this): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar4);
    internal::LogMessage::~LogMessage(&local_68);
  }
  local_a8._M_node = (_Base_ptr)0x0;
  bVar3 = iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::KeyValuePair>
          ::revalidate_if_necessary(&it,&local_a8);
  sVar6 = it.bucket_index_;
  item = it.node_;
  ppvVar1 = this->table_;
  pvVar2 = ppvVar1[it.bucket_index_];
  if (bVar3) {
    if (pvVar2 == (void *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = pvVar2 != ppvVar1[it.bucket_index_ ^ 1];
    }
    if (!bVar3) {
      internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                 ,0x24e);
      pLVar4 = internal::LogMessage::operator<<
                         (&local_a0,"CHECK failed: TableEntryIsNonEmptyList(b): ");
      internal::LogFinisher::operator=(&local_a9,pLVar4);
      internal::LogMessage::~LogMessage(&local_a0);
    }
    pNVar5 = EraseFromLinkedList(this,item,(Node *)this->table_[sVar6]);
    sVar7 = sVar6;
  }
  else {
    if (pvVar2 == (void *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = pvVar2 == ppvVar1[it.bucket_index_ ^ 1];
    }
    if (!bVar3) {
      internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                 ,0x253);
      pLVar4 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: TableEntryIsTree(b): ");
      internal::LogFinisher::operator=(&local_a9,pLVar4);
      internal::LogMessage::~LogMessage(&local_a0);
    }
    this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
               *)this->table_[sVar6];
    pVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
            ::equal_range(this_00,(key_type *)(local_a8._M_node + 1));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::KeyCompare,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::MapAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ::_M_erase_aux(this_00,(_Base_ptr)pVar8.first._M_node,(_Base_ptr)pVar8.second._M_node);
    if ((this_00->_M_impl).super__Rb_tree_header._M_node_count != 0) goto LAB_002cdb4d;
    sVar7 = sVar6 & 0xfffffffffffffffe;
    DestroyTree(this,(Tree *)this_00);
    *(undefined8 *)((long)this->table_ + (sVar6 << 3 | 8)) = 0;
    pNVar5 = (Node *)0x0;
  }
  this->table_[sVar7] = pNVar5;
  sVar6 = sVar7;
LAB_002cdb4d:
  DestroyNode(this,item);
  this->num_elements_ = this->num_elements_ - 1;
  if (sVar6 == this->index_of_first_non_null_) {
    Map<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::
    erase();
  }
  return;
}

Assistant:

void erase(iterator it) {
      GOOGLE_DCHECK_EQ(it.m_, this);
      typename Tree::iterator tree_it;
      const bool is_list = it.revalidate_if_necessary(&tree_it);
      size_type b = it.bucket_index_;
      Node* const item = it.node_;
      if (is_list) {
        GOOGLE_DCHECK(TableEntryIsNonEmptyList(b));
        Node* head = static_cast<Node*>(table_[b]);
        head = EraseFromLinkedList(item, head);
        table_[b] = static_cast<void*>(head);
      } else {
        GOOGLE_DCHECK(TableEntryIsTree(b));
        Tree* tree = static_cast<Tree*>(table_[b]);
        tree->erase(*tree_it);
        if (tree->empty()) {
          // Force b to be the minimum of b and b ^ 1.  This is important
          // only because we want index_of_first_non_null_ to be correct.
          b &= ~static_cast<size_type>(1);
          DestroyTree(tree);
          table_[b] = table_[b + 1] = NULL;
        }
      }
      DestroyNode(item);
      --num_elements_;
      if (GOOGLE_PREDICT_FALSE(b == index_of_first_non_null_)) {
        while (index_of_first_non_null_ < num_buckets_ &&
               table_[index_of_first_non_null_] == NULL) {
          ++index_of_first_non_null_;
        }
      }
    }